

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O3

void __thiscall
DCanvas::DrawTexture(DCanvas *this,FTexture *img,double x,double y,int tags_first,...)

{
  char in_AL;
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list tags;
  DrawParms parms;
  __va_list_tag local_1b8;
  undefined1 local_198 [24];
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  DrawParms local_e8;
  
  local_1b8.reg_save_area = local_198;
  if (in_AL != '\0') {
    local_148 = in_XMM2_Qa;
    local_138 = in_XMM3_Qa;
    local_128 = in_XMM4_Qa;
    local_118 = in_XMM5_Qa;
    local_108 = in_XMM6_Qa;
    local_f8 = in_XMM7_Qa;
  }
  local_1b8.overflow_arg_area = &tags[0].overflow_arg_area;
  local_1b8.gp_offset = 0x18;
  local_1b8.fp_offset = 0x50;
  local_180 = in_RCX;
  local_178 = in_R8;
  local_170 = in_R9;
  bVar1 = ParseDrawTextureTags(this,img,x,y,tags_first,&local_1b8,&local_e8,false);
  if (bVar1) {
    (*(this->super_DObject)._vptr_DObject[0x18])(this,img,&local_e8);
  }
  return;
}

Assistant:

void DCanvas::DrawTexture (FTexture *img, double x, double y, int tags_first, ...)
{
	va_list tags;
	va_start(tags, tags_first);
	DrawParms parms;

	bool res = ParseDrawTextureTags(img, x, y, tags_first, tags, &parms, false);
	va_end(tags);
	if (!res)
	{
		return;
	}
	DrawTextureParms(img, parms);
}